

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMuluMusashi<(moira::Core)1,(moira::Instr)82,(moira::Mode)7,2>
          (Moira *this,u16 opcode)

{
  int iVar1;
  ulong uVar2;
  u32 data;
  u32 ea;
  u32 local_20;
  u32 local_1c;
  
  uVar2 = (ulong)(opcode >> 9 & 7);
  readOp<(moira::Core)1,(moira::Mode)7,2,0ull>(this,opcode & 7,&local_1c,&local_20);
  prefetch<(moira::Core)1,4ull>(this);
  iVar1 = *(ushort *)((long)&(this->reg).field_3 + uVar2 * 4) * local_20;
  (this->reg).sr.n = SUB41((uint)iVar1 >> 0x1f,0);
  (this->reg).sr.z = iVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  *(int *)((long)&(this->reg).field_3 + uVar2 * 4) = iVar1;
  return;
}

Assistant:

void
Moira::execMuluMusashi(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    readOp<C, M, Word>(src, &ea, &data);

    prefetch<C, POLL>();
    result = mulu<C>(data, readD<Word>(dst));

    if constexpr (I == Instr::MULU) { SYNC_68000(50); SYNC_68010(26); }
    if constexpr (I == Instr::MULS) { SYNC_68000(50); SYNC_68010(28); }

    writeD(dst, result);
}